

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

bool __thiscall kj::anon_unknown_35::InMemoryDirectory::exists(InMemoryDirectory *this,PathPtr path)

{
  MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *this_00;
  PathPtr path_00;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 uVar3;
  Maybe<const_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> MVar4;
  size_t sVar5;
  undefined8 extraout_RDX;
  String *pSVar6;
  char *pcVar7;
  StringPtr name;
  StringPtr name_00;
  Path newPath;
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  undefined1 local_68 [32];
  Maybe<kj::_::Mutex::Waiter_&> local_48;
  Impl *pIStack_40;
  
  sVar5 = path.parts.size_;
  pSVar6 = path.parts.ptr;
  if (sVar5 == 0) {
    uVar3 = 1;
  }
  else if (sVar5 == 1) {
    this_00 = &this->impl;
    kj::_::Mutex::lock(&this_00->mutex,SHARED);
    pIStack_40 = &(this->impl).value;
    sVar5 = (pSVar6->content).size_;
    if (sVar5 == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (pSVar6->content).ptr;
    }
    name.content.size_ = sVar5 + (sVar5 == 0);
    name.content.ptr = pcVar7;
    local_48.ptr = (Waiter *)this_00;
    MVar4 = Impl::tryGetEntry(pIStack_40,name);
    if (MVar4.ptr == (EntryImpl *)0x0) {
      uVar3 = false;
    }
    else {
      uVar3 = true;
      if (((MVar4.ptr)->node).tag == 3) {
        SymlinkNode::parse((Path *)local_68,(SymlinkNode *)&((MVar4.ptr)->node).field_1);
        kj::_::Mutex::unlock(&this_00->mutex,SHARED);
        local_48.ptr = (Waiter *)0x0;
        pIStack_40 = (Impl *)0x0;
        path_00.parts.size_ = local_68._8_8_;
        path_00.parts.ptr = (String *)local_68._0_8_;
        uVar3 = exists(this,path_00);
        uVar2 = local_68._8_8_;
        uVar1 = local_68._0_8_;
        if ((_func_int **)local_68._0_8_ != (_func_int **)0x0) {
          local_68._0_8_ = (String *)0x0;
          local_68._8_8_ = (_func_int **)0x0;
          (***(_func_int ***)local_68._16_8_)
                    (local_68._16_8_,uVar1,0x18,uVar2,uVar2,
                     ArrayDisposer::Dispose_<kj::String,_false>::destruct);
        }
      }
    }
    if (local_48.ptr != (Waiter *)0x0) {
      kj::_::Mutex::unlock((Mutex *)local_48.ptr,SHARED);
    }
  }
  else {
    if ((pSVar6->content).size_ == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (pSVar6->content).ptr;
    }
    name_00.content.size_ = (size_t)pcVar7;
    name_00.content.ptr = (char *)this;
    tryGetParent((InMemoryDirectory *)local_68,name_00);
    if ((_func_int **)local_68._8_8_ == (_func_int **)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (**(code **)(*(_func_int **)local_68._8_8_ + 0x40))
                        (local_68._8_8_,pSVar6 + 1,sVar5 - 1);
      (*(code *)**(undefined8 **)local_68._0_8_)
                (local_68._0_8_,local_68._8_8_ + *(long *)(*(_func_int **)local_68._8_8_ + -0x10),
                 extraout_RDX);
    }
  }
  return (bool)uVar3;
}

Assistant:

bool exists(PathPtr path) const override {
    if (path.size() == 0) {
      return true;
    } else if (path.size() == 1) {
      auto lock = impl.lockShared();
      KJ_IF_MAYBE(entry, lock->tryGetEntry(path[0])) {
        return exists(lock, *entry);
      } else {
        return false;
      }
    } else {
      KJ_IF_MAYBE(subdir, tryGetParent(path[0])) {
        return subdir->get()->exists(path.slice(1, path.size()));
      } else {
        return false;
      }
    }
  }